

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDbvt.cpp
# Opt level: O3

void __thiscall btDbvtNodeEnumerator::Process(btDbvtNodeEnumerator *this,btDbvtNode *n)

{
  btDbvtNode **ptr;
  uint uVar1;
  btDbvtNode **ppbVar2;
  ulong uVar3;
  int iVar4;
  
  uVar1 = (this->nodes).m_size;
  if (uVar1 == (this->nodes).m_capacity) {
    iVar4 = 1;
    if (uVar1 != 0) {
      iVar4 = uVar1 * 2;
    }
    if ((int)uVar1 < iVar4) {
      if (iVar4 == 0) {
        ppbVar2 = (btDbvtNode **)0x0;
      }
      else {
        ppbVar2 = (btDbvtNode **)btAlignedAllocInternal((long)iVar4 << 3,0x10);
        uVar1 = (this->nodes).m_size;
      }
      if (0 < (int)uVar1) {
        uVar3 = 0;
        do {
          ppbVar2[uVar3] = (this->nodes).m_data[uVar3];
          uVar3 = uVar3 + 1;
        } while (uVar1 != uVar3);
      }
      ptr = (this->nodes).m_data;
      if ((ptr != (btDbvtNode **)0x0) && ((this->nodes).m_ownsMemory == true)) {
        btAlignedFreeInternal(ptr);
        uVar1 = (this->nodes).m_size;
      }
      (this->nodes).m_ownsMemory = true;
      (this->nodes).m_data = ppbVar2;
      (this->nodes).m_capacity = iVar4;
    }
  }
  (this->nodes).m_data[(int)uVar1] = n;
  (this->nodes).m_size = uVar1 + 1;
  return;
}

Assistant:

void Process(const btDbvtNode* n) { nodes.push_back(n); }